

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O3

int testKNNValidatorSingleKdTreeIndex(void)

{
  ulong uVar1;
  TypeUnion this;
  bool bVar2;
  UniformWeighting *pUVar3;
  NearestNeighborsIndex *this_00;
  SingleKdTreeIndex *pSVar4;
  SquaredEuclideanDistance *pSVar5;
  ostream *poVar6;
  int iVar7;
  Arena *pAVar8;
  Result res;
  Model m1;
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  Model local_70;
  undefined1 local_40 [8];
  _Alloc_hider local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  CoreML::Specification::Model::Model(&local_70,(Arena *)0x0,false);
  CoreML::KNNValidatorTests::generateInterface(&local_70);
  if (local_70._oneof_case_[0] != 0x194) {
    CoreML::Specification::Model::clear_Type(&local_70);
    local_70._oneof_case_[0] = 0x194;
    pAVar8 = (Arena *)(local_70.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_70.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar8 = *(Arena **)pAVar8;
    }
    local_70.Type_.knearestneighborsclassifier_ =
         google::protobuf::Arena::
         CreateMaybeMessage<CoreML::Specification::KNearestNeighborsClassifier>(pAVar8);
  }
  this = local_70.Type_;
  CoreML::KNNValidatorTests::setNumberOfNeighbors
            (local_70.Type_.knearestneighborsclassifier_,3,true);
  if (((this.supportvectorclassifier_)->rho_).total_size_ != 200) {
    CoreML::Specification::KNearestNeighborsClassifier::clear_WeightingScheme
              (this.knearestneighborsclassifier_);
    ((this.supportvectorclassifier_)->rho_).total_size_ = 200;
    uVar1 = ((this.pipelineclassifier_)->super_MessageLite)._internal_metadata_.ptr_;
    pAVar8 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar8 = *(Arena **)pAVar8;
    }
    pUVar3 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::UniformWeighting>
                       (pAVar8);
    ((WeightingSchemeUnion *)((DefaultClassLabelUnion *)&(this.pipeline_)->names_ + 1))->
    uniformweighting_ = pUVar3;
  }
  this_00 = (this.knearestneighborsclassifier_)->nearestneighborsindex_;
  if (this_00 == (NearestNeighborsIndex *)0x0) {
    uVar1 = ((this.pipelineclassifier_)->super_MessageLite)._internal_metadata_.ptr_;
    pAVar8 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar8 = *(Arena **)pAVar8;
    }
    this_00 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::NearestNeighborsIndex>(pAVar8);
    (this.knearestneighborsclassifier_)->nearestneighborsindex_ = this_00;
  }
  if (this_00->_oneof_case_[0] == 0x6e) {
    pSVar4 = (this_00->IndexType_).singlekdtreeindex_;
  }
  else {
    CoreML::Specification::NearestNeighborsIndex::clear_IndexType(this_00);
    this_00->_oneof_case_[0] = 0x6e;
    uVar1 = (this_00->super_MessageLite)._internal_metadata_.ptr_;
    pAVar8 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar8 = *(Arena **)pAVar8;
    }
    pSVar4 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::SingleKdTreeIndex>
                       (pAVar8);
    (this_00->IndexType_).singlekdtreeindex_ = pSVar4;
  }
  if (this_00->_oneof_case_[1] != 200) {
    CoreML::Specification::NearestNeighborsIndex::clear_DistanceFunction(this_00);
    this_00->_oneof_case_[1] = 200;
    uVar1 = (this_00->super_MessageLite)._internal_metadata_.ptr_;
    pAVar8 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar8 = *(Arena **)pAVar8;
    }
    pSVar5 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::SquaredEuclideanDistance>(pAVar8);
    (this_00->DistanceFunction_).squaredeuclideandistance_ = pSVar5;
  }
  CoreML::KNNValidatorTests::addDataPoints(this.knearestneighborsclassifier_);
  CoreML::KNNValidatorTests::addStringLabels(this.knearestneighborsclassifier_);
  CoreML::validate<(MLModelType)404>((Result *)local_98,&local_70);
  bVar2 = CoreML::Result::good((Result *)local_98);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
               ,0x69);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x116);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  }
  else {
    pSVar4->leafsize_ = -1;
    CoreML::validate<(MLModelType)404>((Result *)local_40,&local_70);
    local_98 = local_40;
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_p != &local_28) {
      operator_delete(local_38._M_p,local_28._M_allocated_capacity + 1);
    }
    bVar2 = CoreML::Result::good((Result *)local_98);
    if (bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                 ,0x69);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x11b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"!((res).good())",0xf);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    }
    else {
      pSVar4->leafsize_ = 0x1e;
      CoreML::validate<(MLModelType)404>((Result *)local_40,&local_70);
      local_98 = local_40;
      std::__cxx11::string::operator=((string *)&local_90,(string *)&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_p != &local_28) {
        operator_delete(local_38._M_p,local_28._M_allocated_capacity + 1);
      }
      bVar2 = CoreML::Result::good((Result *)local_98);
      iVar7 = 0;
      if (bVar2) goto LAB_00148865;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                 ,0x69);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x120);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(res).good()",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    }
  }
  std::ostream::put((char)poVar6);
  iVar7 = 1;
  std::ostream::flush();
LAB_00148865:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_p != &local_80) {
    operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_70);
  return iVar7;
}

Assistant:

int testKNNValidatorSingleKdTreeIndex() {

    Specification::Model m1;

    KNNValidatorTests::generateInterface(m1);

    auto *knnClassifier = m1.mutable_knearestneighborsclassifier();
    KNNValidatorTests::setNumberOfNeighbors(knnClassifier, 3, true);
    knnClassifier->mutable_uniformweighting();
    
    auto *nnIndex = knnClassifier->mutable_nearestneighborsindex();
    auto *kdTree = nnIndex->mutable_singlekdtreeindex();
    nnIndex->mutable_squaredeuclideandistance();

    KNNValidatorTests::addDataPoints(knnClassifier);
    KNNValidatorTests::addStringLabels(knnClassifier);

    // leaf size = 0 = bad.  We're requiring the user to specify a leaf size.
    Result res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    // leafSize < 0 = bad
    kdTree->set_leafsize(-1);
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    // leafSize > 0 = good
    kdTree->set_leafsize(30);
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_GOOD(res);

    return 0;
}